

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O0

MessageTemplate * __thiscall
ki::protocol::dml::MessageTemplate::get_handler_abi_cxx11_(MessageTemplate *this)

{
  Record *this_00;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar1;
  string *in_RSI;
  allocator local_41;
  string local_40 [32];
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_20;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *field;
  MessageTemplate *this_local;
  
  this_00 = *(Record **)(in_RSI + 0x28);
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"_MsgHandler",&local_41);
  pFVar1 = ki::dml::Record::get_field<std::__cxx11::string>(this_00,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pFVar1;
  if (pFVar1 == (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    std::__cxx11::string::string((string *)this,in_RSI);
  }
  else {
    ki::dml::Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::get_value((Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this);
  }
  return this;
}

Assistant:

std::string MessageTemplate::get_handler() const
	{
		const auto field = m_record->get_field<ki::dml::STR>("_MsgHandler");
		if (field)
			return field->get_value();
		return m_name;
	}